

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

bool __thiscall Memory::HeapBlockMap32::OOMRescan(HeapBlockMap32 *this,Recycler *recycler)

{
  HeapInfoManager *this_00;
  char *pageAddress;
  HeapBlockType HVar1;
  undefined4 *puVar2;
  L2MapChunk *pLVar3;
  HeapBlock *pHVar4;
  PageAllocatorBaseCommon *pPVar5;
  size_t sVar6;
  L2MapChunk *chunk;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  code *pcVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  IdleDecommitPageAllocator *pIVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  IdleDecommitPageAllocator *pageAllocator;
  char *pcVar19;
  ulong uVar20;
  undefined8 *in_FS_OFFSET;
  Segment *local_58;
  HeapInfo *this_01;
  
  this->anyHeapBlockRescannedDuringOOM = false;
  puVar2 = (undefined4 *)*in_FS_OFFSET;
  this_00 = &recycler->autoHeap;
  bVar8 = 1;
  lVar13 = 0;
  local_58 = (Segment *)0x0;
  do {
    pLVar3 = this->map[lVar13];
    if (pLVar3 != (L2MapChunk *)0x0) {
      lVar17 = 0;
      do {
        pHVar4 = pLVar3->map[lVar17];
        if (pHVar4 != (HeapBlock *)0x0) {
          if (pHVar4->segment == (Segment *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar2 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                               ,0x240,"(block->GetSegment() != nullptr)",
                               "block->GetSegment() != nullptr");
            if (!bVar9) goto LAB_0021611a;
            *puVar2 = 0;
          }
          if (pHVar4->segment == local_58) {
            if (local_58 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar2 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x243,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar9) goto LAB_0021611a;
              *puVar2 = 0;
            }
            if ((pHVar4->address < local_58->address) ||
               (local_58->address +
                (local_58->segmentPageCount - (ulong)local_58->secondaryAllocPageCount) * 0x1000 <=
                pHVar4->address)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar2 = 1;
              uVar16 = 0x244;
              pcVar19 = "(currentSegment->IsInSegment(block->GetAddress()))";
              pcVar15 = "currentSegment->IsInSegment(block->GetAddress())";
LAB_00215c14:
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,uVar16,pcVar19,pcVar15);
              if (!bVar9) {
LAB_0021611a:
                pcVar7 = (code *)invalidInstructionException();
                (*pcVar7)();
              }
              *puVar2 = 0;
            }
          }
          else {
            if (local_58 != (Segment *)0x0) {
              if ((local_58->address <= pHVar4->address) &&
                 (pHVar4->address <
                  local_58->address +
                  (local_58->segmentPageCount - (ulong)local_58->secondaryAllocPageCount) * 0x1000))
              {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar2 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x249,
                                   "(currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress()))"
                                   ,
                                   "currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress())"
                                  );
                if (!bVar9) goto LAB_0021611a;
                *puVar2 = 0;
              }
            }
            local_58 = pHVar4->segment;
            if (local_58 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar2 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x24b,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar9) goto LAB_0021611a;
              *puVar2 = 0;
            }
            pPVar5 = (local_58->super_SegmentBaseCommon).allocator;
            pcVar15 = local_58->address;
            sVar6 = local_58->segmentPageCount;
            pageAllocator = (IdleDecommitPageAllocator *)&pPVar5[-1].allocatorType;
            if (pPVar5 == (PageAllocatorBaseCommon *)0x0) {
              pageAllocator = (IdleDecommitPageAllocator *)0x0;
            }
            iVar10 = (*pHVar4->_vptr_HeapBlock[5])(pHVar4);
            this_01 = (HeapInfo *)CONCAT44(extraout_var,iVar10);
            HVar1 = pHVar4->heapBlockType;
            if (HVar1 < 0xc) {
              if ((0x630U >> (HVar1 & 0x1f) & 1) == 0) {
                if ((0x84U >> (HVar1 & 0x1f) & 1) == 0) {
                  if (HVar1 != 0xb) goto LAB_00215c4f;
                  pIVar11 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_01);
                }
                else {
                  pIVar11 = HeapInfo::GetRecyclerLeafPageAllocator(this_01);
                }
              }
              else {
                pIVar11 = HeapInfo::GetRecyclerWithBarrierPageAllocator(this_01);
              }
            }
            else {
LAB_00215c4f:
              pIVar11 = HeapInfo::GetRecyclerPageAllocator(this_01);
            }
            if (pageAllocator != pIVar11) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar2 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x251,
                                 "(segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo()))"
                                 ,
                                 "segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo())"
                                );
              if (!bVar9) goto LAB_0021611a;
              *puVar2 = 0;
            }
            pcVar19 = (char *)(sVar6 * 0x1000);
            if (pcVar15 < this->startAddress) {
              if (pcVar19 <= this->startAddress + -(long)pcVar15) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar2 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,600,
                                   "(segmentLength > (size_t)(this->startAddress - segmentStart))",
                                   "segmentLength > (size_t)(this->startAddress - segmentStart)");
                if (!bVar9) goto LAB_0021611a;
                *puVar2 = 0;
              }
              pcVar19 = pcVar15 + ((long)pcVar19 - (long)this->startAddress);
              pcVar15 = this->startAddress;
            }
            lVar12 = (long)pcVar15 - (long)this->startAddress;
            pcVar18 = (char *)(0x100000000 - lVar12);
            if (pcVar19 + lVar12 < (char *)0x100000001) {
              pcVar18 = pcVar19;
            }
            if (((ulong)pcVar18 & 0xfff) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar2 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x3e1,"(segmentLength % AutoSystemInfo::PageSize == 0)",
                                 "segmentLength % AutoSystemInfo::PageSize == 0");
              if (!bVar9) goto LAB_0021611a;
              *puVar2 = 0;
            }
            bVar9 = HeapInfoManager::IsRecyclerPageAllocator
                              (this_00,&pageAllocator->super_PageAllocator);
            if ((bVar9) ||
               (bVar9 = HeapInfoManager::IsRecyclerWithBarrierPageAllocator
                                  (this_00,&pageAllocator->super_PageAllocator), bVar9)) {
              bVar9 = Recycler::NeedOOMRescan(recycler);
              if ((!bVar9) && ((char *)0xfff < pcVar18)) {
                uVar20 = (ulong)pcVar18 >> 0xc;
                pcVar19 = (char *)0x0;
                do {
                  if (pcVar18 <= pcVar19) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar2 = 1;
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,0x3f6,
                                       "((size_t)(pageAddress - segmentStart) < segmentLength)",
                                       "(size_t)(pageAddress - segmentStart) < segmentLength");
                    if (!bVar9) goto LAB_0021611a;
                    *puVar2 = 0;
                  }
                  pageAddress = pcVar15 + (long)pcVar19;
                  if (this->startAddress != (char *)((ulong)pageAddress & 0xffffffff00000000)) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar2 = 1;
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,0x3f9,
                                       "(HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress)"
                                       ,
                                       "HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress"
                                      );
                    if (!bVar9) goto LAB_0021611a;
                    *puVar2 = 0;
                  }
                  chunk = this->map[(ulong)pageAddress >> 0x14 & 0xfff];
                  if (chunk == (L2MapChunk *)0x0) goto LAB_00216088;
                  uVar14 = (ulong)pageAddress >> 0xc & 0xff;
                  heapBlock = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)
                              chunk->map[uVar14];
                  if (((heapBlock ==
                        (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) ||
                      (pageAddress !=
                       (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                       address)) ||
                     ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                      needOOMRescan != true)) goto LAB_00216088;
                  (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                  needOOMRescan = false;
                  HVar1 = chunk->blockInfo[uVar14].blockType;
                  switch(HVar1) {
                  case FreeBlockType:
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar2 = 1;
                    uVar16 = 0x40f;
                    goto LAB_00216057;
                  case LargeBlockTypeCount:
                  case SmallNormalBlockWithBarrierType:
                    bVar9 = RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                                      (this,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *
                                            )heapBlock,pageAddress,HVar1,
                                       (uint)chunk->blockInfo[uVar14].bucketIndex,chunk,recycler);
                    break;
                  default:
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar2 = 1;
                    uVar16 = 0x44c;
LAB_00216057:
                    bVar9 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,uVar16,"(false)","false");
                    if (bVar9) {
                      *puVar2 = 0;
                      bVar8 = 0;
                      goto LAB_00216088;
                    }
                    goto LAB_0021611a;
                  case SmallFinalizableBlockType:
                  case MediumAllocBlockTypeCount:
                    bVar9 = RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                                      (this,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>
                                             *)heapBlock,pageAddress,HVar1,
                                       (uint)chunk->blockInfo[uVar14].bucketIndex,chunk,recycler);
                    break;
                  case MediumNormalBlockType:
                  case MediumNormalBlockWithBarrierType:
                    bVar9 = RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                                      (this,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes>
                                             *)heapBlock,pageAddress,HVar1,
                                       (uint)chunk->blockInfo[uVar14].bucketIndex,chunk,recycler);
                    break;
                  case MediumFinalizableBlockType:
                  case MediumFinalizableBlockWithBarrierType:
                    bVar9 = RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                                      (this,heapBlock,pageAddress,HVar1,
                                       (uint)chunk->blockInfo[uVar14].bucketIndex,chunk,recycler);
                  }
                  bVar8 = 0;
                  if (bVar9 == false) break;
LAB_00216088:
                  pcVar19 = pcVar19 + 0x1000;
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
              }
            }
            else {
              bVar9 = HeapInfoManager::IsRecyclerLeafPageAllocator
                                (this_00,&pageAllocator->super_PageAllocator);
              if ((!bVar9) &&
                 (bVar9 = HeapInfoManager::IsRecyclerLargeBlockPageAllocator
                                    (this_00,&pageAllocator->super_PageAllocator), !bVar9)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar2 = 1;
                uVar16 = 0x457;
                pcVar19 = 
                "(recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) || recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator))"
                ;
                pcVar15 = 
                "recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) || recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator)"
                ;
                goto LAB_00215c14;
              }
            }
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x100);
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 0x1000) {
      return (bool)(bVar8 | this->anyHeapBlockRescannedDuringOOM & 1U);
    }
  } while( true );
}

Assistant:

bool
HeapBlockMap32::OOMRescan(Recycler * recycler)
{
    this->anyHeapBlockRescannedDuringOOM = false;
    bool noHeapBlockNeedsRescan = true;

    // Loop through segments and find pages that need OOM Rescan.

    this->ForEachSegment(recycler, [=, &noHeapBlockNeedsRescan] (char * segmentStart, size_t segmentLength, Segment * currentSegment, PageAllocator * segmentPageAllocator) {
        Assert(segmentLength % AutoSystemInfo::PageSize == 0);

        // Process Small non-leaf segments (including write barrier blocks).
        // Large blocks have their own separate write watch handling.
        if (recycler->autoHeap.IsRecyclerPageAllocator(segmentPageAllocator)
#ifdef RECYCLER_WRITE_BARRIER
            || recycler->autoHeap.IsRecyclerWithBarrierPageAllocator(segmentPageAllocator)
#endif
            )
        {
            if (recycler->NeedOOMRescan())
            {
                // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
                return;
            }

            // Loop through pages for this segment and check OOM flag.
            size_t pageCount = segmentLength / AutoSystemInfo::PageSize;
            for (size_t i = 0; i < pageCount; i++)
            {
                char * pageAddress = segmentStart + (i * AutoSystemInfo::PageSize);
                Assert((size_t)(pageAddress - segmentStart) < segmentLength);

#if defined(TARGET_64)
                Assert(HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress);
#endif

                uint id1 = GetLevel1Id(pageAddress);
                L2MapChunk * chunk = map[id1];
                if (chunk != nullptr)
                {
                    uint id2 = GetLevel2Id(pageAddress);
                    HeapBlock * heapBlock = chunk->map[id2];
                    if (heapBlock != nullptr && heapBlock->GetAddress() == pageAddress)
                    {
                        if (heapBlock->GetAndClearNeedOOMRescan())
                        {
                            noHeapBlockNeedsRescan = false;

                            HeapBlock::HeapBlockType blockType = chunk->blockInfo[id2].blockType;

                            // Determine block type and process as appropriate
                            switch (blockType)
                            {
                            case HeapBlock::HeapBlockType::FreeBlockType:
                                // Can't have a free block that has OOMRescan flag set
                                Assert(false);
                                break;

                            case HeapBlock::HeapBlockType::SmallNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<SmallNormalHeapBlock>((SmallNormalHeapBlock*)heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;

                            case HeapBlock::HeapBlockType::SmallFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<SmallFinalizableHeapBlock>((SmallFinalizableHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#ifdef RECYCLER_VISITED_HOST
                            case HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType:
                                if (!RescanHeapBlockOnOOM<SmallRecyclerVisitedHostHeapBlock>((SmallRecyclerVisitedHostHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#endif

                            case HeapBlock::HeapBlockType::MediumNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<MediumNormalHeapBlock>((MediumNormalHeapBlock*)heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;

                            case HeapBlock::HeapBlockType::MediumFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<MediumFinalizableHeapBlock>((MediumFinalizableHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#ifdef RECYCLER_VISITED_HOST
                            case HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType:
                                if (!RescanHeapBlockOnOOM<MediumRecyclerVisitedHostHeapBlock>((MediumRecyclerVisitedHostHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#endif

                            default:
                                // Shouldn't be here -- leaf blocks aren't rescanned, and large blocks are handled separately
                                Assert(false);
                                break;
                            }
                        }
                    }
                }
            }
        }
        else
        {
            Assert(recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) ||
                recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator));
        }
    });

    // TODO: Enable this assert post-Win10
    // Assert(this->anyHeapBlockRescannedDuringOOM);
    // Success if:
    //  No heap block needs OOM rescan OR
    //  A single heap block was rescanned
    return noHeapBlockNeedsRescan || this->anyHeapBlockRescannedDuringOOM;
}